

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapDrive.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_580a1::MapDrivePlugIn::drawPathFencesOnMap
          (MapDrivePlugIn *this,TerrainMap *map,GCRoute *path)

{
  float fVar1;
  int iVar2;
  int j;
  int j_00;
  int i;
  int i_00;
  float fVar3;
  Vec3 nextRow;
  Vec3 g;
  Vec3 local_3c;
  
  iVar2 = *(int *)((long)&(this->vehicles).
                          super__Vector_base<(anonymous_namespace)::MapDriver_*,_std::allocator<(anonymous_namespace)::MapDriver_*>_>
                          ._M_impl.super__Vector_impl_data._M_start + 4);
  fVar3 = *(float *)((long)&this->vehicle + 4);
  fVar1 = *(float *)&(this->vehicles).
                     super__Vector_base<(anonymous_namespace)::MapDriver_*,_std::allocator<(anonymous_namespace)::MapDriver_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
  local_3c.x = fVar3 / (float)iVar2;
  local_3c.y = 0.0;
  local_3c.z = 0.0;
  nextRow.z = fVar1 / (float)iVar2;
  nextRow.x = -fVar3;
  nextRow.y = 0.0;
  g.x = (fVar3 - local_3c.x) * -0.5;
  g.z = (fVar1 - nextRow.z) * -0.5;
  g.y = 0.0;
  for (j_00 = 0; j_00 < iVar2; j_00 = j_00 + 1) {
    for (i_00 = 0; i_00 < iVar2; i_00 = i_00 + 1) {
      fVar3 = mapPointToOutside((PolylineSegmentedPathwaySegmentRadii *)map,&g);
      if ((0.0 < fVar3) && (fVar3 < 1.0)) {
        TerrainMap::setMapBit((TerrainMap *)this,i_00,j_00,true);
      }
      if (1.0 < fVar3) {
        TerrainMap::setMapBit((TerrainMap *)this,i_00,j_00,false);
      }
      OpenSteer::Vec3::operator+=(&g,&local_3c);
      iVar2 = *(int *)((long)&(this->vehicles).
                              super__Vector_base<(anonymous_namespace)::MapDriver_*,_std::allocator<(anonymous_namespace)::MapDriver_*>_>
                              ._M_impl.super__Vector_impl_data._M_start + 4);
    }
    OpenSteer::Vec3::operator+=(&g,&nextRow);
    iVar2 = *(int *)((long)&(this->vehicles).
                            super__Vector_base<(anonymous_namespace)::MapDriver_*,_std::allocator<(anonymous_namespace)::MapDriver_*>_>
                            ._M_impl.super__Vector_impl_data._M_start + 4);
  }
  return;
}

Assistant:

void drawPathFencesOnMap (TerrainMap& map, GCRoute& path)
        {
    #ifdef OLDTERRAINMAP
            const float xs = map.xSize / (float)map.resolution;
            const float zs = map.zSize / (float)map.resolution;
            const Vec3 alongRow (xs, 0, 0);
            const Vec3 nextRow (-map.xSize, 0, zs);
            Vec3 g ((map.xSize - xs) / -2, 0, (map.zSize - zs) / -2);
            for (int j = 0; j < map.resolution; j++)
            {
                for (int i = 0; i < map.resolution; i++)
                {
                    const float outside = mapPointToOutside( path, g ); // path.howFarOutsidePath (g);
                    const float wallThickness = 1.0f;

                    // set map cells adjacent to the outside edge of the path
                    if ((outside > 0) && (outside < wallThickness))
                        map.setMapBit (i, j, true);

                    // clear all other off-path map cells 
                    if (outside > wallThickness) map.setMapBit (i, j, false);

                    g += alongRow;
                }
                g += nextRow;
            }
    #else
    #endif
        }